

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O0

ConstPixelBufferAccess *
dit::anon_unknown_0::getInputAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,TextureFormat format)

{
  Vector<int,_3> local_50;
  Vector<int,_3> local_44;
  int local_38;
  TextureFormat TStack_34;
  int numPixels;
  int local_2c;
  TextureFormat TStack_28;
  int inputPixelSize;
  TextureFormat local_20;
  TextureFormat inputFormat;
  TextureFormat format_local;
  
  TStack_28 = format;
  inputFormat = format;
  TStack_34 = getBaseFormat(format);
  local_20 = TStack_34;
  local_2c = tcu::getPixelSize(TStack_34);
  local_38 = *(int *)((anonymous_namespace)::s_formatData + ((ulong)inputFormat >> 0x20) * 0x28 + 8)
             / local_2c;
  tcu::Vector<int,_3>::Vector(&local_44,local_38,1,1);
  tcu::Vector<int,_3>::Vector(&local_50,local_2c,0,0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&inputFormat,&local_44,&local_50,
             *(void **)((anonymous_namespace)::s_formatData + ((ulong)inputFormat >> 0x20) * 0x28));
  return __return_storage_ptr__;
}

Assistant:

ConstPixelBufferAccess getInputAccess (TextureFormat format)
{
	const TextureFormat	inputFormat		= getBaseFormat(format);
	const int			inputPixelSize	= getPixelSize(inputFormat);
	const int			numPixels		= s_formatData[format.type].inputSize / inputPixelSize;

	DE_ASSERT(numPixels == 4);
	DE_ASSERT(numPixels*inputPixelSize == s_formatData[format.type].inputSize);

	return ConstPixelBufferAccess(format, IVec3(numPixels, 1, 1), IVec3(inputPixelSize, 0, 0), s_formatData[format.type].input);
}